

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O0

void tcp_dowrite(nni_tcp_conn *c)

{
  nni_aio *pnVar1;
  nng_err result;
  ssize_t sVar2;
  int *piVar3;
  size_t count;
  uint local_f0;
  int local_ec;
  uint i;
  int niov;
  iovec iovec [8];
  msghdr hdr;
  nni_iov *aiov;
  int local_20;
  uint naiov;
  int n;
  int fd;
  nni_aio *aio;
  nni_tcp_conn *c_local;
  
  aio = (nni_aio *)c;
  naiov = nni_posix_pfd_fd(&c->pfd);
  if (((aio->a_task).task_cv.cv.__size[0x28] & 1U) == 0) {
    do {
      while( true ) {
        _n = (nni_aio *)nni_list_first((nni_list *)((long)&(aio->a_task).task_cv.cv + 0x10));
        if (_n == (nni_aio *)0x0) {
          return;
        }
        nni_aio_get_iov(_n,(uint *)((long)&aiov + 4),(nni_iov **)&hdr.msg_flags);
        if (8 < aiov._4_4_) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_tcpconn.c"
                    ,0x30,"naiov <= NNI_AIO_MAX_IOV");
        }
        memset(&iovec[7].iov_len,0,0x38);
        local_ec = 0;
        for (local_f0 = 0; local_f0 < aiov._4_4_; local_f0 = local_f0 + 1) {
          if (*(long *)(hdr._48_8_ + (ulong)local_f0 * 0x10 + 8) != 0) {
            iovec[local_ec].iov_base = *(void **)(hdr._48_8_ + (ulong)local_f0 * 0x10 + 8);
            *(undefined8 *)(&i + (long)local_ec * 4) =
                 *(undefined8 *)(hdr._48_8_ + (ulong)local_f0 * 0x10);
            local_ec = local_ec + 1;
          }
        }
        hdr.msg_iov = (iovec *)(long)local_ec;
        hdr._8_8_ = &i;
        sVar2 = sendmsg(naiov,(msghdr *)&iovec[7].iov_len,0x4000);
        local_20 = (int)sVar2;
        if (local_20 < 0) break;
        nni_aio_bump_count(_n,(long)local_20);
        nni_aio_list_remove(_n);
        pnVar1 = _n;
        count = nni_aio_count(_n);
        nni_aio_finish(pnVar1,NNG_OK,count);
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if (*piVar3 != 0xb) {
      nni_aio_list_remove(_n);
      pnVar1 = _n;
      piVar3 = __errno_location();
      result = nni_plat_errno(*piVar3);
      nni_aio_finish_error(pnVar1,result);
    }
  }
  return;
}

Assistant:

static void
tcp_dowrite(nni_tcp_conn *c)
{
	nni_aio *aio;
	int      fd = nni_posix_pfd_fd(&c->pfd);

	if (c->closed) {
		return;
	}

	while ((aio = nni_list_first(&c->writeq)) != NULL) {
		int      n;
		unsigned naiov;
		nni_iov *aiov;

		nni_aio_get_iov(aio, &naiov, &aiov);

		NNI_ASSERT(naiov <= NNI_AIO_MAX_IOV);

#ifdef NNG_HAVE_SENDMSG
		struct msghdr hdr = { 0 };
		struct iovec  iovec[NNI_AIO_MAX_IOV];
		int           niov;
		unsigned      i;
		for (niov = 0, i = 0; i < naiov; i++) {
			if (aiov[i].iov_len > 0) {
				iovec[niov].iov_len  = aiov[i].iov_len;
				iovec[niov].iov_base = aiov[i].iov_buf;
				niov++;
			}
		}

		hdr.msg_iovlen = niov;
		hdr.msg_iov    = iovec;

		n = sendmsg(fd, &hdr, MSG_NOSIGNAL);
#else
		// We have to send a bit at a time.
		n = send(fd, aiov[0].iov_buf, aiov[0].iov_len, MSG_NOSIGNAL);
#endif
		if (n < 0) {
			switch (errno) {
			case EINTR:
				continue;
			case EAGAIN:
#ifdef EWOULDBLOCK
#if EWOULDBLOCK != EAGAIN
			case EWOULDBLOCK:
#endif
#endif
				return;
			default:
				nni_aio_list_remove(aio);
				nni_aio_finish_error(
				    aio, nni_plat_errno(errno));
				return;
			}
		}

		nni_aio_bump_count(aio, n);
		nni_aio_list_remove(aio);
		nni_aio_finish(aio, 0, nni_aio_count(aio));

		// Go back to start of loop to see if there is another
		// aio ready for us to process.
	}
}